

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.h
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::FunctionCreationContext::computeTypeLocals
          (FunctionCreationContext *this)

{
  ulong uVar1;
  mapped_type *this_00;
  ulong uVar2;
  key_type local_20;
  value_type_conflict3 local_14;
  FunctionCreationContext *pFStack_10;
  Index i;
  FunctionCreationContext *this_local;
  
  pFStack_10 = this;
  std::
  unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::clear(&this->typeLocals);
  local_14 = 0;
  while( true ) {
    uVar2 = (ulong)local_14;
    uVar1 = wasm::Function::getNumLocals();
    if (uVar1 <= uVar2) break;
    local_20.id = wasm::Function::getLocalType((uint)this->func);
    this_00 = std::
              unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->typeLocals,&local_20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_14);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void computeTypeLocals() {
      typeLocals.clear();
      for (Index i = 0; i < func->getNumLocals(); i++) {
        typeLocals[func->getLocalType(i)].push_back(i);
      }
    }